

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_internal_defs.hpp
# Opt level: O0

string * iutest::detail::GetTypeNameProxy<iutest::Types<int,float>>::GetTypeName_abi_cxx11_(void)

{
  string *in_RDI;
  
  GetTypeName<iutest::Types<int,float>>();
  return in_RDI;
}

Assistant:

static ::std::string    GetTypeName() { return detail::GetTypeName<T>(); }